

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::AddHDChain(LegacyScriptPubKeyMan *this,CHDChain *chain)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  bool bVar6;
  LegacyDataSPKM *this_00;
  runtime_error *this_01;
  int64_t *in_RSI;
  CHDChain *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  WalletBatch *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  uint uVar7;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  allocator<char> *in_stack_ffffffffffffff78;
  CHDChain *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69 [2];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(char *)in_RDI,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  this_00 = (LegacyDataSPKM *)
            (**(code **)(**(long **)(in_RDI->seed_id).super_uint160.super_base_blob<160U>.m_data.
                                    _M_elems + 0x18))();
  WalletBatch::WalletBatch
            (in_stack_ffffffffffffff48,
             (WalletDatabase *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (bool)in_stack_ffffffffffffff3f);
  bVar6 = WalletBatch::WriteHDChain
                    (in_stack_ffffffffffffff48,
                     (CHDChain *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  uVar7 = (uint)CONCAT11(bVar6,bVar6) << 0x10 ^ 0xff0000;
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if ((uVar7 & 0x10000) == 0) {
    bVar6 = base_blob<160U>::IsNull((base_blob<160U> *)in_stack_ffffffffffffff48);
    if (!bVar6) {
      LegacyDataSPKM::AddInactiveHDChain(this_00,in_RDI);
    }
    *(int *)&in_RDI[7].m_next_external_index = (int)in_RSI[6];
    iVar1 = *in_RSI;
    iVar2 = in_RSI[1];
    iVar3 = in_RSI[2];
    iVar4 = in_RSI[3];
    iVar5 = in_RSI[5];
    *(int64_t *)(in_RDI[7].seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems + 8) =
         in_RSI[4];
    *(int64_t *)(in_RDI[7].seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
         iVar5;
    in_RDI[7].nExternalChainCounter = (int)iVar3;
    in_RDI[7].nInternalChainCounter = (int)((ulong)iVar3 >> 0x20);
    *(int64_t *)in_RDI[7].seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems = iVar4;
    in_RDI[6].m_next_internal_index = iVar1;
    *(int64_t *)&in_RDI[6].nVersion = iVar2;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
               (char *)in_RSI,in_stack_ffffffffffffff78);
    std::operator+(__lhs,(char *)this_01);
    std::runtime_error::runtime_error(this_01,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddHDChain(const CHDChain& chain)
{
    LOCK(cs_KeyStore);
    // Store the new chain
    if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(chain)) {
        throw std::runtime_error(std::string(__func__) + ": writing chain failed");
    }
    // When there's an old chain, add it as an inactive chain as we are now rotating hd chains
    if (!m_hd_chain.seed_id.IsNull()) {
        AddInactiveHDChain(m_hd_chain);
    }

    m_hd_chain = chain;
}